

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
AddBotsIRCCommand::trigger
          (AddBotsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  size_type sVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  long *plVar8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  split_parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  container_type local_60;
  long *local_48;
  long *local_40;
  long local_38;
  
  pcVar5 = channel._M_str;
  sVar6 = channel._M_len;
  lVar3 = Jupiter::IRC::Client::getChannel(source,sVar6,pcVar5,pcVar5,nick._M_len,nick._M_str);
  if (lVar3 == 0) {
    return;
  }
  RenX::getCore();
  Jupiter::IRC::Client::getChannel(source,sVar6,pcVar5);
  Jupiter::IRC::Client::Channel::getType();
  RenX::Core::getServers((int)&local_48);
  if (local_48 == local_40) {
    Jupiter::IRC::Client::sendMessage
              (source,sVar6,pcVar5,0x40,
               "Error: Channel not attached to any connected Renegade X servers.");
    goto LAB_0012eaa8;
  }
  jessilib::
  word_split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
            (&local_60,parameters._M_str,parameters._M_str + parameters._M_len," \t","");
  if (local_60.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_60.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar7 = 1;
LAB_0012e929:
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    uVar2 = 3;
    if (0x10 < (ulong)((long)local_60.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_60.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      uVar2 = RenX::getTeam(local_60.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_len);
    }
    if (uVar2 < 4) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_a0,0,local_a0._M_string_length,
                 &DAT_0013a7b0 + *(int *)(&DAT_0013a7b0 + (ulong)uVar2 * 4),
                 *(size_type *)(&DAT_0013e050 + (ulong)uVar2 * 8));
    }
    if (local_48 != local_40) {
      plVar8 = local_48;
      do {
        sVar1 = local_a0._M_string_length;
        if (*plVar8 != 0) {
          string_printf_abi_cxx11_(&local_80,"%u",uVar7);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_a0,local_80._M_dataplus._M_p,local_80._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          RenX::Server::send(*plVar8,local_a0._M_string_length,local_a0._M_dataplus._M_p);
          if (local_a0._M_string_length < sVar1) {
            uVar4 = std::__throw_out_of_range_fmt
                              ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                               "basic_string::erase",sVar1);
            if (local_48 != (long *)0x0) {
              operator_delete(local_48,local_38 - (long)local_48);
            }
            _Unwind_Resume(uVar4);
          }
          local_a0._M_dataplus._M_p[sVar1] = '\0';
        }
        lVar3 = *plVar8;
        local_a0._M_string_length = sVar1;
        string_printf_abi_cxx11_(&local_80,"%u bots have been added to the server.",uVar7);
        RenX::Server::sendMessage(lVar3,local_80._M_string_length,local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        plVar8 = plVar8 + 1;
      } while (plVar8 != local_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    uVar2 = Jupiter_strtoi_s((local_60.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_str,
                             (local_60.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_len,0);
    uVar7 = (ulong)uVar2;
    if (uVar2 != 0) goto LAB_0012e929;
    Jupiter::IRC::Client::sendMessage
              (source,sVar6,pcVar5,0x41,
               "Error: Invalid amount entered. Amount must be a positive integer.");
  }
  if (local_60.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0012eaa8:
  if (local_48 != (long *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return;
}

Assistant:

void AddBotsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(source->getChannel(channel)->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	int amount = 1;
	std::vector<std::string_view> split_parameters = jessilib::word_split_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.empty()) {
		amount = Jupiter::asInt(split_parameters.front());
		if (amount == 0) {
			source->sendMessage(channel, "Error: Invalid amount entered. Amount must be a positive integer."sv);
			return;
		}
	}

	std::string cmd;
	RenX::TeamType team = RenX::TeamType::None;
	if (split_parameters.size() >= 2) {
		team = RenX::getTeam(split_parameters[1]);
	}

	switch (team) {
	case RenX::TeamType::GDI:
		cmd = "addredbots ";
		break;
	case RenX::TeamType::Nod:
		cmd = "addbluebots ";
		break;
	case RenX::TeamType::None:
	case RenX::TeamType::Other:
		cmd = "addbots ";
		break;
	}

	for (const auto& server : servers) {
		size_t base_length = cmd.size();
		if (server != nullptr) {
			cmd += string_printf("%u", amount);
			server->send(cmd);
			cmd.erase(base_length);
		}
		server->sendMessage(string_printf("%u bots have been added to the server.", amount));
	}
}